

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall
wasm::PrintExpressionContents::visitSIMDExtract(PrintExpressionContents *this,SIMDExtract *curr)

{
  long lVar1;
  char *pcVar2;
  ostream *poVar3;
  
  poVar3 = this->o;
  Colors::outputColorCode(poVar3,"\x1b[35m");
  Colors::outputColorCode(poVar3,"\x1b[1m");
  switch(curr->op) {
  case ExtractLaneSVecI8x16:
    poVar3 = this->o;
    pcVar2 = "i8x16.extract_lane_s";
    goto LAB_00a2fff7;
  case ExtractLaneUVecI8x16:
    poVar3 = this->o;
    pcVar2 = "i8x16.extract_lane_u";
    goto LAB_00a2fff7;
  case ExtractLaneSVecI16x8:
    poVar3 = this->o;
    pcVar2 = "i16x8.extract_lane_s";
    goto LAB_00a2fff7;
  case ExtractLaneUVecI16x8:
    poVar3 = this->o;
    pcVar2 = "i16x8.extract_lane_u";
LAB_00a2fff7:
    lVar1 = 0x14;
    goto LAB_00a30028;
  case ExtractLaneVecI32x4:
    poVar3 = this->o;
    pcVar2 = "i32x4.extract_lane";
    break;
  case ExtractLaneVecI64x2:
    poVar3 = this->o;
    pcVar2 = "i64x2.extract_lane";
    break;
  case ExtractLaneVecF16x8:
    poVar3 = this->o;
    pcVar2 = "f16x8.extract_lane";
    break;
  case ExtractLaneVecF32x4:
    poVar3 = this->o;
    pcVar2 = "f32x4.extract_lane";
    break;
  case ExtractLaneVecF64x2:
    poVar3 = this->o;
    pcVar2 = "f64x2.extract_lane";
    break;
  default:
    goto switchD_00a2ffa9_default;
  }
  lVar1 = 0x12;
LAB_00a30028:
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar2,lVar1);
switchD_00a2ffa9_default:
  Colors::outputColorCode(this->o,"\x1b[0m");
  poVar3 = this->o;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  std::ostream::operator<<(poVar3,(uint)curr->index);
  return;
}

Assistant:

void visitSIMDExtract(SIMDExtract* curr) {
    prepareColor(o);
    switch (curr->op) {
      case ExtractLaneSVecI8x16:
        o << "i8x16.extract_lane_s";
        break;
      case ExtractLaneUVecI8x16:
        o << "i8x16.extract_lane_u";
        break;
      case ExtractLaneSVecI16x8:
        o << "i16x8.extract_lane_s";
        break;
      case ExtractLaneUVecI16x8:
        o << "i16x8.extract_lane_u";
        break;
      case ExtractLaneVecI32x4:
        o << "i32x4.extract_lane";
        break;
      case ExtractLaneVecI64x2:
        o << "i64x2.extract_lane";
        break;
      case ExtractLaneVecF16x8:
        o << "f16x8.extract_lane";
        break;
      case ExtractLaneVecF32x4:
        o << "f32x4.extract_lane";
        break;
      case ExtractLaneVecF64x2:
        o << "f64x2.extract_lane";
        break;
    }
    restoreNormalColor(o);
    o << " " << int(curr->index);
  }